

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

void __thiscall SQFuncState::AddLineInfos(SQFuncState *this,SQInteger line,bool lineop,bool force)

{
  long lVar1;
  SQLineInfo li;
  SQLineInfo local_20;
  
  lVar1 = this->_lastline;
  if (lVar1 != line || force) {
    local_20._op = (this->_instructions)._size;
    local_20._line = line;
    if (lineop) {
      AddInstruction(this,_OP_LINE,0,line,0,0);
      lVar1 = this->_lastline;
    }
    if (lVar1 != line) {
      sqvector<SQLineInfo>::push_back(&this->_lineinfos,&local_20);
    }
    this->_lastline = line;
  }
  return;
}

Assistant:

void SQFuncState::AddLineInfos(SQInteger line,bool lineop,bool force)
{
    if(_lastline!=line || force){
        SQLineInfo li;
        li._line=line;li._op=(GetCurrentPos()+1);
        if(lineop)AddInstruction(_OP_LINE,0,line);
        if(_lastline!=line) {
            _lineinfos.push_back(li);
        }
        _lastline=line;
    }
}